

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppmb_io.cpp
# Opt level: O2

bool ppmb_write(string *output_name,int xsize,int ysize,uchar *r,uchar *g,uchar *b)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  uint maxrgb;
  ulong uVar4;
  int iVar5;
  uchar *puVar6;
  uchar *puVar7;
  uchar *puVar8;
  long lVar9;
  uint uVar10;
  ofstream output;
  uint auStack_210 [120];
  
  std::ofstream::ofstream(&output);
  std::ofstream::open((char *)&output,(_Ios_Openmode)(output_name->_M_dataplus)._M_p);
  uVar1 = *(uint *)((long)auStack_210 + *(long *)(_output + -0x18));
  if ((uVar1 & 5) == 0) {
    iVar2 = 0;
    uVar4 = 0;
    if (0 < xsize) {
      uVar4 = (ulong)(uint)xsize;
    }
    iVar5 = 0;
    if (0 < ysize) {
      iVar5 = ysize;
    }
    maxrgb = 0;
    puVar6 = b;
    puVar7 = r;
    puVar8 = g;
    for (; iVar2 != iVar5; iVar2 = iVar2 + 1) {
      for (lVar9 = 0; (int)uVar4 != (int)lVar9; lVar9 = lVar9 + 1) {
        if (maxrgb < puVar7[lVar9]) {
          maxrgb = (uint)puVar7[lVar9];
        }
        uVar10 = (uint)puVar8[lVar9];
        if (puVar8[lVar9] <= maxrgb) {
          uVar10 = maxrgb;
        }
        maxrgb = (uint)puVar6[lVar9];
        if (puVar6[lVar9] <= uVar10) {
          maxrgb = uVar10;
        }
      }
      puVar6 = puVar6 + uVar4;
      puVar7 = puVar7 + uVar4;
      puVar8 = puVar8 + uVar4;
    }
    ppmb_write_header(&output,xsize,ysize,maxrgb);
    ppmb_write_data(&output,xsize,ysize,r,g,b);
    std::ofstream::close();
  }
  else {
    std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<((ostream *)&std::cout,"PPMB_WRITE: Fatal error!\n");
    poVar3 = std::operator<<((ostream *)&std::cout,"  Cannot open the output file ");
    poVar3 = std::operator<<(poVar3,(string *)output_name);
    std::operator<<(poVar3,".\n");
  }
  std::ofstream::~ofstream(&output);
  return (uVar1 & 5) != 0;
}

Assistant:

bool ppmb_write ( string output_name, int xsize, int ysize, 
  unsigned char *r, unsigned char *g, unsigned char *b )

//****************************************************************************80
//
//  Purpose:
//
//    PPMB_WRITE writes the header and data for a binary portable pixel map file.
//
//  Discussion:
//
//    Thanks to Jonas Schwertfeger for pointing out that, especially on Microsoft
//    Windows systems, a binary file needs to be opened as a binary file!
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
// 
//    11 April 2003
// 
//  Author:
// 
//    John Burkardt
//
//  Parameters:
//
//    Input, string OUTPUT_NAME, the name of the file to contain the binary
//    portable pixel map data.
//
//    Input, int XSIZE, YSIZE, the number of rows and columns of data.
//
//    Input, unsigned char *R, *G, *B, the arrays of XSIZE by YSIZE 
//    data values.
//
//    Output, bool PPMB_WRITE, is true if an error occurred.
//
{
  bool error;
  ofstream output;
  int i;
  unsigned char *indexb;
  unsigned char *indexg;
  unsigned char *indexr;
  int j;
  int maxrgb;
//
//  Open the output file.
//
  output.open ( output_name.c_str ( ), ios::binary );

  if ( !output )
  {
    cout << "\n";
    cout << "PPMB_WRITE: Fatal error!\n";
    cout << "  Cannot open the output file " << output_name << ".\n";
    return true;
  }
//
//  Compute the maximum.
//
  maxrgb = 0;
  indexr = r;
  indexg = g;
  indexb = b;

  for ( j = 0; j < ysize; j++ )
  {
    for ( i = 0; i < xsize; i++ )
    {
      maxrgb = i4_max ( maxrgb, *indexr );
      maxrgb = i4_max ( maxrgb, *indexg );
      maxrgb = i4_max ( maxrgb, *indexb );
      indexr = indexr + 1;
      indexg = indexg + 1;
      indexb = indexb + 1;
    }
  }
//
//  Write the header.
//
  error = ppmb_write_header ( output, xsize, ysize, maxrgb );

  if ( error )
  {
    cout << "\n";
    cout << "PPMB_WRITE: Fatal error!\n";
    cout << "  PPMB_WRITE_HEADER failed.\n";
    return true;
  }
//
//  Write the data.
//
  error = ppmb_write_data ( output, xsize, ysize, r, g, b );

  if ( error )
  {
    cout << "\n";
    cout << "PPMB_WRITE: Fatal error!\n";
    cout << "  PPMB_WRITE_DATA failed.\n";
    return true;
  }
//
//  Close the file.
//
  output.close ( );

  return false;
}